

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O2

void vertSyncHandler(void)

{
  int iVar1;
  uint uVar2;
  SDL_Event event;
  
  iVar1 = SDL_GetTicks();
  uVar2 = iVar1 - ticks;
  if (vsyncEvent != 0xffffffff) {
    SDL_memset(&event,0,0x38);
    event.type = vsyncEvent;
    SDL_PushEvent(&event);
  }
  if (uVar2 < 0x10) {
    SDL_Delay(0x10 - uVar2);
  }
  ticks = SDL_GetTicks();
  return;
}

Assistant:

void vertSyncHandler(void) {
    Uint32 frametime = SDL_GetTicks() - ticks;

    if (vsyncEvent != ((Uint32) -1)) {
        SDL_Event event;
        SDL_memset(&event, 0, sizeof(event));
        event.type = vsyncEvent;
        SDL_PushEvent(&event);
    }

    if (frametime < idealFrameTime) {
    	SDL_Delay(idealFrameTime - frametime);
    }

    ticks = SDL_GetTicks();
}